

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * columnName(sqlite3_stmt *pStmt,int N,int useUtf16,int useType)

{
  byte bVar1;
  sqlite3 *db;
  uint uVar2;
  ulong uVar3;
  sqlite3_value *pVal;
  u16 *puVar4;
  
  if (N < 0) {
    return (void *)0x0;
  }
  db = *(sqlite3 **)pStmt;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  uVar2 = *(uint *)(pStmt + 200) >> 2 & 3;
  if (uVar2 == 0) {
    if ((uint)N < (uint)*(ushort *)(pStmt + 0xc0)) {
      bVar1 = db->mallocFailed;
      pVal = (sqlite3_value *)
             ((ulong)((uint)*(ushort *)(pStmt + 0xc0) * useType + N) * 0x38 +
             *(long *)(pStmt + 0x98));
      if (useUtf16 == 0) {
        puVar4 = (u16 *)sqlite3_value_text(pVal);
      }
      else {
        puVar4 = (u16 *)sqlite3_value_text16(pVal);
      }
      if (db->mallocFailed <= bVar1) goto LAB_0011c677;
      sqlite3OomClear(db);
    }
  }
  else if ((useType < 1) && ((uint)N < (uint)((short)uVar2 == 1) * 4 + 4)) {
    uVar3 = (ulong)((N + uVar2 * 8) - 8);
    if (useUtf16 == 0) {
      puVar4 = (u16 *)(azExplainColNames8_rel + *(int *)(azExplainColNames8_rel + uVar3 * 4));
    }
    else {
      puVar4 = azExplainColNames16data + ""[uVar3];
    }
    goto LAB_0011c677;
  }
  puVar4 = (u16 *)0x0;
LAB_0011c677:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return puVar4;
}

Assistant:

static const void *columnName(
  sqlite3_stmt *pStmt,     /* The statement */
  int N,                   /* Which column to get the name for */
  int useUtf16,            /* True to return the name as UTF16 */
  int useType              /* What type of name */
){
  const void *ret;
  Vdbe *p;
  int n;
  sqlite3 *db;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pStmt==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  if( N<0 ) return 0;
  ret = 0;
  p = (Vdbe *)pStmt;
  db = p->db;
  assert( db!=0 );
  sqlite3_mutex_enter(db->mutex);

  if( p->explain ){
    if( useType>0 ) goto columnName_end;
    n = p->explain==1 ? 8 : 4;
    if( N>=n ) goto columnName_end;
    if( useUtf16 ){
      int i = iExplainColNames16[N + 8*p->explain - 8];
      ret = (void*)&azExplainColNames16data[i];
    }else{
      ret = (void*)azExplainColNames8[N + 8*p->explain - 8];
    }
    goto columnName_end;
  }
  n = p->nResColumn;
  if( N<n ){
    u8 prior_mallocFailed = db->mallocFailed;
    N += useType*n;
#ifndef SQLITE_OMIT_UTF16
    if( useUtf16 ){
      ret = sqlite3_value_text16((sqlite3_value*)&p->aColName[N]);
    }else
#endif
    {
      ret = sqlite3_value_text((sqlite3_value*)&p->aColName[N]);
    }
    /* A malloc may have failed inside of the _text() call. If this
    ** is the case, clear the mallocFailed flag and return NULL.
    */
    assert( db->mallocFailed==0 || db->mallocFailed==1 );
    if( db->mallocFailed > prior_mallocFailed ){
      sqlite3OomClear(db);
      ret = 0;
    }
  }
columnName_end:
  sqlite3_mutex_leave(db->mutex);
  return ret;
}